

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getGlobal
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name name)

{
  key_type *__k;
  mapped_type *pmVar1;
  long lVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  Name NVar6;
  Name NVar7;
  Module *pMVar5;
  
  pcVar4 = name.super_IString.str._M_len;
  pMVar5 = this->wasm;
  while( true ) {
    NVar6.super_IString.str._M_str = pcVar4;
    NVar6.super_IString.str._M_len = (size_t)pMVar5;
    __k = (key_type *)wasm::Module::getGlobal(NVar6);
    if (__k[2].super_IString.str._M_len == 0) break;
    pmVar1 = std::
             map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
             ::at(&this->linkedInstances,(key_type *)&__k[1].super_IString.str._M_str);
    this = &((pmVar1->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_ModuleRunnerBase<wasm::ModuleRunner>;
    NVar7.super_IString.str._M_str = __k[2].super_IString.str._M_str;
    NVar7.super_IString.str._M_len = (size_t)this->wasm;
    lVar2 = wasm::Module::getExport(NVar7);
    pMVar5 = this->wasm;
    pcVar4 = *(char **)(lVar2 + 0x10);
  }
  pmVar3 = std::
           map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
           ::operator[](&this->globals,__k);
  return pmVar3;
}

Assistant:

Literals& getGlobal(Name name) {
    auto* inst = self();
    auto* global = inst->wasm.getGlobal(name);
    while (global->imported()) {
      inst = inst->linkedInstances.at(global->module).get();
      Export* globalExport = inst->wasm.getExport(global->base);
      global = inst->wasm.getGlobal(globalExport->value);
    }

    return inst->globals[global->name];
  }